

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

cmFileLockResult __thiscall cmFileLockPool::ScopePool::Release(ScopePool *this,string *filename)

{
  cmFileLockResult in_RAX;
  undefined7 extraout_var;
  cmFileLockResult cVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)this;
  do {
    p_Var2 = (((List *)&p_Var2->_M_next)->
             super__List_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)this) goto LAB_003173e1;
    in_RAX.Type._0_1_ = cmFileLock::IsLocked(*(cmFileLock **)(p_Var2 + 1),filename);
    in_RAX._1_7_ = extraout_var;
  } while (!in_RAX.Type._0_1_);
  in_RAX = cmFileLock::Release(*(cmFileLock **)(p_Var2 + 1));
LAB_003173e1:
  if (p_Var2 != (_List_node_base *)this) {
    return in_RAX;
  }
  cVar1 = cmFileLockResult::MakeOk();
  return cVar1;
}

Assistant:

cmFileLockResult cmFileLockPool::ScopePool::Release(
    const std::string& filename)
{
  for (It i = this->Locks.begin(); i != this->Locks.end(); ++i)
    {
    if ((*i)->IsLocked(filename))
      {
      return (*i)->Release();
      }
    }
  return cmFileLockResult::MakeOk();
}